

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

void tinf_build_fixed_trees(tinf_tree *lt,tinf_tree *dt)

{
  int local_1c;
  int i;
  tinf_tree *dt_local;
  tinf_tree *lt_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    lt->counts[local_1c] = 0;
  }
  lt->counts[7] = 0x18;
  lt->counts[8] = 0x98;
  lt->counts[9] = 0x70;
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    lt->symbols[local_1c] = (short)local_1c + 0x100;
  }
  for (local_1c = 0; local_1c < 0x90; local_1c = local_1c + 1) {
    lt->symbols[local_1c + 0x18] = (unsigned_short)local_1c;
  }
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    lt->symbols[local_1c + 0xa8] = (short)local_1c + 0x118;
  }
  for (local_1c = 0; local_1c < 0x70; local_1c = local_1c + 1) {
    lt->symbols[local_1c + 0xb0] = (short)local_1c + 0x90;
  }
  lt->max_sym = 0x11d;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    dt->counts[local_1c] = 0;
  }
  dt->counts[5] = 0x20;
  for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
    dt->symbols[local_1c] = (unsigned_short)local_1c;
  }
  dt->max_sym = 0x1d;
  return;
}

Assistant:

static void tinf_build_fixed_trees(struct tinf_tree *lt, struct tinf_tree *dt)
{
	int i;

	/* Build fixed literal/length tree */
	for (i = 0; i < 16; ++i) {
		lt->counts[i] = 0;
	}

	lt->counts[7] = 24;
	lt->counts[8] = 152;
	lt->counts[9] = 112;

	for (i = 0; i < 24; ++i) {
		lt->symbols[i] = 256 + i;
	}
	for (i = 0; i < 144; ++i) {
		lt->symbols[24 + i] = i;
	}
	for (i = 0; i < 8; ++i) {
		lt->symbols[24 + 144 + i] = 280 + i;
	}
	for (i = 0; i < 112; ++i) {
		lt->symbols[24 + 144 + 8 + i] = 144 + i;
	}

	lt->max_sym = 285;

	/* Build fixed distance tree */
	for (i = 0; i < 16; ++i) {
		dt->counts[i] = 0;
	}

	dt->counts[5] = 32;

	for (i = 0; i < 32; ++i) {
		dt->symbols[i] = i;
	}

	dt->max_sym = 29;
}